

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O0

size_t ZSTD_compressBegin_advanced
                 (ZSTD_CCtx *cctx,void *dict,size_t dictSize,ZSTD_parameters params,
                 unsigned_long_long pledgedSrcSize)

{
  size_t sVar1;
  ZSTD_CCtx_params cctxParams;
  int in_stack_ffffffffffffff34;
  ZSTD_CDict *in_stack_ffffffffffffff38;
  ZSTD_dictTableLoadMethod_e in_stack_ffffffffffffff40;
  ZSTD_dictContentType_e in_stack_ffffffffffffff44;
  size_t in_stack_ffffffffffffff48;
  void *in_stack_ffffffffffffff50;
  ZSTD_CCtx *in_stack_ffffffffffffff58;
  ZSTD_CCtx_params *in_stack_ffffffffffffff70;
  unsigned_long_long in_stack_ffffffffffffff78;
  
  ZSTD_CCtxParams_init_internal
            ((ZSTD_CCtx_params *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
             (ZSTD_parameters *)in_stack_ffffffffffffff38,in_stack_ffffffffffffff34);
  sVar1 = ZSTD_compressBegin_advanced_internal
                    (in_stack_ffffffffffffff58,in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,
                     in_stack_ffffffffffffff44,in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,
                     in_stack_ffffffffffffff70,in_stack_ffffffffffffff78);
  return sVar1;
}

Assistant:

size_t ZSTD_compressBegin_advanced(ZSTD_CCtx* cctx,
                             const void* dict, size_t dictSize,
                                   ZSTD_parameters params, unsigned long long pledgedSrcSize)
{
    ZSTD_CCtx_params cctxParams;
    ZSTD_CCtxParams_init_internal(&cctxParams, &params, ZSTD_NO_CLEVEL);
    return ZSTD_compressBegin_advanced_internal(cctx,
                                            dict, dictSize, ZSTD_dct_auto, ZSTD_dtlm_fast,
                                            NULL /*cdict*/,
                                            &cctxParams, pledgedSrcSize);
}